

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_object.cpp
# Opt level: O2

double mjs::anon_unknown_37::date_helper::make_day(double year,double month,double day)

{
  time_t tVar1;
  tm tm;
  
  if ((ulong)ABS(day) < 0x7ff0000000000000 &&
      ((ulong)ABS(month) < 0x7ff0000000000000 && (ulong)ABS(year) < 0x7ff0000000000000)) {
    tm.tm_wday = 0;
    tm.tm_yday = 0;
    tm.tm_zone = (char *)0x0;
    tm.tm_sec = 0;
    tm.tm_min = 0;
    tm.tm_isdst = 0;
    tm._36_4_ = 0;
    tm.tm_gmtoff = 0;
    tm.tm_year = (int)month / 0xc + (int)year + -0x76c;
    tm.tm_mon = (int)month % 0xc;
    tm._8_8_ = (ulong)(uint)(int)day << 0x20;
    tVar1 = timegm((tm *)&tm);
    return (double)tVar1 / 86400.0;
  }
  return NAN;
}

Assistant:

static double make_day(double year, double month, double day) {
        if (!std::isfinite(year) || !std::isfinite(month) || !std::isfinite(day)) {
            return NAN;
        }
        const auto y = static_cast<int32_t>(year) + static_cast<int32_t>(month)/12;
        const auto m = static_cast<int32_t>(month) % 12;
        const auto d = static_cast<int32_t>(day);
        // non-standard :/
        std::tm tm;
        std::memset(&tm, 0, sizeof(tm));
        tm.tm_year = y - 1900;
        tm.tm_mon = m;
        tm.tm_mday = d;
        return static_cast<double>(_mkgmtime(&tm)) / 86400;
    }